

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco.cpp
# Opt level: O2

string * RCO::fileExtensionFromType(string *__return_storage_ptr__,string *type)

{
  bool bVar1;
  allocator *paVar2;
  char *pcVar3;
  allocator local_1e;
  allocator local_1d;
  allocator local_1c;
  allocator local_1b;
  allocator local_1a;
  allocator local_19;
  allocator local_18;
  allocator local_17;
  allocator local_16;
  allocator local_15;
  allocator local_14;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  
  bVar1 = std::operator==(type,"texture/jpg");
  if (bVar1) {
    pcVar3 = "jpg";
    paVar2 = &local_11;
  }
  else {
    bVar1 = std::operator==(type,"texture/tif");
    if (bVar1) {
      pcVar3 = "tif";
      paVar2 = &local_12;
    }
    else {
      bVar1 = std::operator==(type,"texture/gif");
      if (bVar1) {
        pcVar3 = "gif";
        paVar2 = &local_13;
      }
      else {
        bVar1 = std::operator==(type,"texture/gxt");
        if (bVar1) {
          pcVar3 = "gxt";
          paVar2 = &local_14;
        }
        else {
          bVar1 = std::operator==(type,"texture/gim");
          if (bVar1) {
            pcVar3 = "gim";
            paVar2 = &local_15;
          }
          else {
            bVar1 = std::operator==(type,"texture/png");
            pcVar3 = "png";
            if (bVar1) {
              paVar2 = &local_16;
            }
            else {
              bVar1 = std::operator==(type,"png");
              if (bVar1) {
                pcVar3 = "png";
                paVar2 = &local_17;
              }
              else {
                bVar1 = std::operator==(type,"texture/dds");
                if (bVar1) {
                  pcVar3 = "dds";
                  paVar2 = &local_18;
                }
                else {
                  bVar1 = std::operator==(type,"sound/vag");
                  if (bVar1) {
                    pcVar3 = "vag";
                    paVar2 = &local_19;
                  }
                  else {
                    bVar1 = std::operator==(type,"sound/wav");
                    if (bVar1) {
                      pcVar3 = "wav";
                      paVar2 = &local_1a;
                    }
                    else {
                      bVar1 = std::operator==(type,"sound/mp3");
                      if (bVar1) {
                        pcVar3 = "mp3";
                        paVar2 = &local_1b;
                      }
                      else {
                        bVar1 = std::operator==(type,"sound/at3");
                        if (bVar1) {
                          pcVar3 = "at3";
                          paVar2 = &local_1c;
                        }
                        else {
                          bVar1 = std::operator==(type,"sound/aac");
                          if (bVar1) {
                            pcVar3 = "aac";
                            paVar2 = &local_1d;
                          }
                          else {
                            pcVar3 = "bin";
                            paVar2 = &local_1e;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,paVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string RCO::fileExtensionFromType(std::string type)
{
	if (type == "texture/jpg")
		return "jpg";
	if (type == "texture/tif")
		return "tif";
	if (type == "texture/gif")
		return "gif";
	if (type == "texture/gxt")
		return "gxt";
	if (type == "texture/gim")
		return "gim";
	if (type == "texture/png")
		return "png";
	// Some PS4 RCOs have just png and not texture/png
	if (type == "png")
		return "png";
	if (type == "texture/dds")
		return "dds";
	if (type == "sound/vag")
		return "vag";
	if (type == "sound/wav")
		return "wav";
	if (type == "sound/mp3")
		return "mp3";
	if (type == "sound/at3")
		return "at3";
	if (type == "sound/aac")
		return "aac";
	return "bin";
}